

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NetAliasSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NetAliasSyntax,slang::syntax::NetAliasSyntax_const&>
          (BumpAllocator *this,NetAliasSyntax *args)

{
  NetAliasSyntax *this_00;
  
  this_00 = (NetAliasSyntax *)allocate(this,0xa8,8);
  slang::syntax::NetAliasSyntax::NetAliasSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }